

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Jupiter::Socket::~Socket(Socket *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Data *this_00;
  int in_ESI;
  
  this->_vptr_Socket = (_func_int **)&PTR_connect_00146910;
  this_00 = this->m_data;
  if (this_00 == (Data *)0x0) {
    return;
  }
  if (0 < this_00->rawSock) {
    close(this,in_ESI);
    this_00 = this->m_data;
    if (this_00 == (Data *)0x0) {
      this_00 = (Data *)0x0;
      goto LAB_00137a90;
    }
  }
  pcVar2 = (this_00->bound_host)._M_dataplus._M_p;
  paVar1 = &(this_00->bound_host).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this_00->remote_host)._M_dataplus._M_p;
  paVar1 = &(this_00->remote_host).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Buffer::~Buffer(&this_00->buffer);
LAB_00137a90:
  operator_delete(this_00,0x70);
  return;
}

Assistant:

Jupiter::Socket::~Socket() {
	if (m_data != nullptr) {
		if (m_data->rawSock > 0)
			Jupiter::Socket::close();
		delete m_data;
	}
}